

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5ConfigParse
              (Fts5Global *pGlobal,sqlite3 *db,int nArg,char **azArg,Fts5Config **ppOut,char **pzErr
              )

{
  char cVar1;
  bool bVar2;
  Fts5Config *pFVar3;
  u8 *puVar4;
  byte bVar5;
  int iVar6;
  int iVar7;
  char **ppcVar8;
  char *pcVar9;
  char *pcVar10;
  size_t sVar11;
  int *piVar12;
  byte *pbVar13;
  byte *pbVar14;
  byte bVar15;
  long lVar16;
  ulong uVar17;
  char **ppcVar18;
  long lVar19;
  uchar uVar20;
  uint uVar21;
  uchar uVar22;
  long lVar23;
  byte *pbVar24;
  bool bVar25;
  int bDummy;
  char *zTwo;
  int bMustBeCol;
  char *zOne;
  int local_b8;
  int local_b4;
  Fts5Config *local_b0;
  char **local_a8;
  byte *local_a0;
  char **local_98;
  int local_8c;
  Fts5Buffer local_88;
  char **local_70;
  long local_68;
  byte *local_60;
  Fts5Tokenizer **local_58;
  Fts5Global *local_50;
  fts5_tokenizer **local_48;
  Fts5Config **local_40;
  long local_38;
  
  local_b8 = 0;
  local_a8 = pzErr;
  iVar6 = sqlite3_initialize();
  iVar7 = 7;
  if (iVar6 != 0) goto LAB_001c6db2;
  local_98 = azArg;
  local_b0 = (Fts5Config *)sqlite3Malloc(0xa8);
  *ppOut = local_b0;
  if (local_b0 == (Fts5Config *)0x0) {
    return 7;
  }
  local_40 = ppOut;
  memset(&local_b0->zDb,0,0xa0);
  local_b0->db = db;
  local_b0->iCookie = -1;
  lVar23 = (long)nArg;
  ppcVar8 = (char **)sqlite3Fts5MallocZero(&local_b8,lVar23 * 9);
  ppcVar18 = local_98;
  local_b0->azCol = ppcVar8;
  local_b0->abUnindexed = (u8 *)(ppcVar8 + lVar23);
  local_38 = lVar23;
  pcVar9 = sqlite3Fts5Strndup(&local_b8,local_98[1],-1);
  local_b0->zDb = pcVar9;
  pcVar9 = sqlite3Fts5Strndup(&local_b8,ppcVar18[2],-1);
  ppcVar18 = local_a8;
  local_b0->zName = pcVar9;
  local_b0->bColumnsize = 1;
  local_b0->eDetail = 0;
  iVar7 = local_b8;
  if (pcVar9 != (char *)0x0 && local_b8 == 0) {
    lVar23 = 0;
    do {
      bVar5 = pcVar9[lVar23];
      if (bVar5 == "rank"[lVar23]) {
        if ((ulong)bVar5 == 0) goto LAB_001c645d;
      }
      else if (""[bVar5] != ""[(byte)"rank"[lVar23]]) {
        iVar7 = 0;
        break;
      }
      lVar23 = lVar23 + 1;
    } while( true );
  }
  bVar25 = iVar7 == 0;
  local_50 = pGlobal;
  if (3 < nArg && bVar25) {
    local_58 = &local_b0->pTok;
    local_48 = &local_b0->pTokApi;
    lVar23 = 3;
    ppcVar18 = local_98;
LAB_001c64c5:
    local_88.p = (byte *)0x0;
    local_a0 = (byte *)0x0;
    local_8c = 0;
    pcVar9 = fts5ConfigGobbleWord(&local_b8,ppcVar18[lVar23],(char **)&local_88,&local_8c);
    bVar25 = true;
    if (pcVar9 != (char *)0x0) {
      do {
        pcVar10 = pcVar9;
        cVar1 = *pcVar10;
        pcVar9 = pcVar10 + 1;
      } while (cVar1 == ' ');
      bVar2 = cVar1 != '=';
      if ((cVar1 == '=') && (pcVar10 = pcVar10 + 1, local_8c != 0)) {
        bVar2 = false;
        goto LAB_001c65fd;
      }
      pcVar10 = pcVar10 + -1;
      do {
        pcVar9 = pcVar10 + 1;
        pcVar10 = pcVar10 + 1;
      } while (*pcVar9 == ' ');
      if (*pcVar9 != '\0') {
        pcVar9 = fts5ConfigGobbleWord(&local_b8,pcVar10,(char **)&local_a0,&local_b4);
        if (pcVar9 == (char *)0x0) {
          bVar25 = true;
        }
        else {
          bVar25 = *pcVar9 != '\0';
        }
        goto LAB_001c65fd;
      }
      iVar7 = local_b8;
      if (local_b8 != 0) goto LAB_001c6d3d;
      pbVar24 = (byte *)0x0;
      if (cVar1 != '=') goto LAB_001c6646;
LAB_001c6559:
      puVar4 = local_88.p;
      if (pbVar24 == (byte *)0x0) {
        pbVar24 = (byte *)0x1dc0d0;
      }
      local_b4 = 0;
      sVar11 = strlen((char *)local_88.p);
      pFVar3 = local_b0;
      if (puVar4 != (byte *)0x0) {
        if (0 < (int)sVar11) {
          pbVar13 = puVar4 + 6;
          lVar16 = (ulong)((int)sVar11 - 1) + 1;
          lVar19 = 0;
          do {
            if (lVar19 == 6) {
              uVar20 = '\0';
              pbVar14 = pbVar13;
LAB_001c6753:
              if (uVar20 != ""[*pbVar14]) {
                pbVar14 = puVar4 + 8;
                lVar19 = 0;
                goto LAB_001c683d;
              }
              break;
            }
            uVar20 = ""[(byte)"prefix"[lVar19]];
            if (uVar20 != ""[puVar4[lVar19]]) {
              pbVar14 = puVar4 + lVar19;
              goto LAB_001c6753;
            }
            lVar19 = lVar19 + 1;
          } while (lVar16 != lVar19);
        }
        piVar12 = local_b0->aPrefix;
        if (piVar12 != (int *)0x0) {
LAB_001c6775:
          bVar5 = 0;
          do {
            pbVar24 = pbVar24 + -1;
            do {
              bVar15 = pbVar24[1];
              pbVar24 = pbVar24 + 1;
            } while (bVar15 == 0x20);
            if ((bool)(~bVar5 & 1 | bVar15 != 0x2c)) {
              if (bVar15 == 0) goto LAB_001c6bb3;
            }
            else {
              do {
                bVar15 = pbVar24[1];
                pbVar24 = pbVar24 + 1;
              } while (bVar15 == 0x20);
            }
            if ((byte)(bVar15 - 0x3a) < 0xf6) {
              pcVar9 = "malformed prefix=... directive";
              goto LAB_001c688a;
            }
            if ((long)local_b0->nPrefix == 0x1f) {
              pcVar9 = sqlite3_mprintf("too many prefix indexes (max %d)");
              goto LAB_001c6d2b;
            }
            iVar7 = 0;
            do {
              if ((0x39 < bVar15) || (999 < iVar7)) break;
              iVar7 = (uint)(byte)(bVar15 - 0x30) + iVar7 * 10;
              bVar15 = pbVar24[1];
              pbVar24 = pbVar24 + 1;
            } while ('/' < (char)bVar15);
            if (iVar7 - 1000U < 0xfffffc19) goto LAB_001c6883;
            piVar12[local_b0->nPrefix] = iVar7;
            local_b0->nPrefix = local_b0->nPrefix + 1;
            bVar5 = 1;
          } while( true );
        }
        piVar12 = (int *)sqlite3Fts5MallocZero(&local_b4,0x7c);
        pFVar3->aPrefix = piVar12;
        iVar7 = local_b4;
        if (local_b4 == 0) goto LAB_001c6775;
        goto LAB_001c6d3d;
      }
LAB_001c6d18:
      pcVar9 = sqlite3_mprintf("unrecognized option: \"%.*s\"",sVar11 & 0xffffffff,puVar4);
      goto LAB_001c6d2b;
    }
    bVar2 = true;
LAB_001c65fd:
    iVar7 = local_b8;
    if (local_b8 == 0) {
      if (bVar25) {
        pcVar9 = sqlite3_mprintf("parse error in \"%s\"");
        *local_a8 = pcVar9;
        local_b8 = 1;
        iVar7 = local_b8;
        goto LAB_001c6d3d;
      }
      pbVar24 = local_a0;
      if (!bVar2) goto LAB_001c6559;
LAB_001c6646:
      puVar4 = local_88.p;
      if (local_88.p != (byte *)0x0) {
        lVar16 = 0;
        do {
          bVar5 = local_88.p[lVar16];
          if (bVar5 == "rank"[lVar16]) {
            if ((ulong)bVar5 == 0) goto LAB_001c66dd;
          }
          else if (""[bVar5] != ""[(byte)"rank"[lVar16]]) {
            lVar16 = 0;
            goto LAB_001c668c;
          }
          lVar16 = lVar16 + 1;
        } while( true );
      }
LAB_001c66b0:
      iVar7 = 0;
      if (pbVar24 != (byte *)0x0) {
        lVar16 = 0;
        do {
          bVar5 = pbVar24[lVar16];
          if (bVar5 == "unindexed"[lVar16]) {
            if ((ulong)bVar5 == 0) goto LAB_001c66e9;
          }
          else if (""[bVar5] != ""[(byte)"unindexed"[lVar16]]) {
            pcVar9 = "unrecognized column option: %s";
            goto LAB_001c6706;
          }
          lVar16 = lVar16 + 1;
        } while( true );
      }
      goto LAB_001c671b;
    }
    goto LAB_001c6d3d;
  }
LAB_001c6d6a:
  if (bVar25) {
    if (local_b0->pTok == (Fts5Tokenizer *)0x0) {
      iVar7 = sqlite3Fts5GetTokenizer
                        (local_50,(char **)0x0,0,&local_b0->pTok,&local_b0->pTokApi,(char **)0x0);
      local_b8 = iVar7;
    }
    pFVar3 = local_b0;
    if (iVar7 == 0) {
      if (local_b0->zContent == (char *)0x0) {
        if (local_b0->eContent == 0) {
          pcVar9 = "content";
        }
        else {
          if (local_b0->bColumnsize == 0) goto LAB_001c6de1;
          pcVar9 = "docsize";
        }
        pcVar9 = sqlite3Fts5Mprintf(&local_b8,"%Q.\'%q_%s\'",local_b0->zDb,local_b0->zName,pcVar9);
        pFVar3->zContent = pcVar9;
        iVar7 = local_b8;
        if (local_b8 != 0) goto LAB_001c6da3;
      }
LAB_001c6de1:
      pFVar3 = local_b0;
      pcVar9 = local_b0->zContentRowid;
      if (pcVar9 == (char *)0x0) {
        pcVar9 = sqlite3Fts5Strndup(&local_b8,"rowid",-1);
        pFVar3->zContentRowid = pcVar9;
        iVar7 = local_b8;
        if (local_b8 != 0) goto LAB_001c6da3;
      }
      pFVar3 = local_b0;
      local_a0 = (byte *)((ulong)local_a0 & 0xffffffff00000000);
      local_88.p = (byte *)0x0;
      local_88.n = 0;
      local_88.nSpace = 0;
      sqlite3Fts5BufferAppendPrintf((int *)&local_a0,&local_88,"T.%Q",pcVar9);
      if ((pFVar3->eContent != 1) && (0 < pFVar3->nCol)) {
        uVar17 = 0;
        do {
          if (pFVar3->eContent == 2) {
            sqlite3Fts5BufferAppendPrintf((int *)&local_a0,&local_88,", T.%Q",pFVar3->azCol[uVar17])
            ;
          }
          else {
            sqlite3Fts5BufferAppendPrintf((int *)&local_a0,&local_88,", T.c%d",uVar17 & 0xffffffff);
          }
          uVar17 = uVar17 + 1;
        } while ((long)uVar17 < (long)pFVar3->nCol);
      }
      pFVar3->zContentExprlist = (char *)local_88.p;
      iVar7 = (int)local_a0;
      if ((int)local_a0 == 0) {
        return 0;
      }
    }
  }
  goto LAB_001c6da3;
LAB_001c668c:
  bVar5 = local_88.p[lVar16];
  if (bVar5 == "SELECT name, rootpage, sql FROM \'%q\'.%s WHERE %s ORDER BY rowid"[lVar16 + 0x3a]) {
    if ((ulong)bVar5 == 0) goto LAB_001c66dd;
  }
  else if (""[bVar5] !=
           ""[(byte)"SELECT name, rootpage, sql FROM \'%q\'.%s WHERE %s ORDER BY rowid"
                    [lVar16 + 0x3a]]) goto LAB_001c66b0;
  lVar16 = lVar16 + 1;
  goto LAB_001c668c;
LAB_001c66dd:
  pcVar9 = "reserved fts5 column name: %s";
  pbVar24 = local_88.p;
LAB_001c6706:
  pcVar9 = sqlite3_mprintf(pcVar9,pbVar24);
  *local_a8 = pcVar9;
  iVar7 = 1;
LAB_001c671b:
  iVar6 = local_b0->nCol;
  local_b0->nCol = iVar6 + 1;
  local_b0->azCol[iVar6] = (char *)puVar4;
  local_88.p = (byte *)0x0;
  ppcVar18 = local_98;
  goto LAB_001c6d3d;
LAB_001c66e9:
  local_b0->abUnindexed[local_b0->nCol] = '\x01';
  goto LAB_001c671b;
  while( true ) {
    uVar20 = ""[(byte)"tokenize"[lVar19]];
    if (uVar20 != ""[puVar4[lVar19]]) {
      pbVar14 = puVar4 + lVar19;
      goto LAB_001c68a1;
    }
    lVar19 = lVar19 + 1;
    if (lVar16 == lVar19) break;
LAB_001c683d:
    if (lVar19 == 8) {
      uVar20 = '\0';
LAB_001c68a1:
      if (uVar20 != ""[*pbVar14]) {
        pbVar14 = puVar4 + 7;
        lVar19 = 0;
        goto LAB_001c692d;
      }
      break;
    }
  }
  sVar11 = strlen((char *)pbVar24);
  ppcVar8 = (char **)sqlite3Fts5MallocZero(&local_b4,sVar11 * 8 + 8);
  pbVar13 = (byte *)sqlite3Fts5MallocZero(&local_b4,sVar11 * 2 + 2);
  iVar7 = local_b4;
  local_70 = ppcVar8;
  local_60 = pbVar13;
  if (ppcVar8 != (char **)0x0 && pbVar13 != (byte *)0x0) {
    if (*local_58 == (Fts5Tokenizer *)0x0) {
      bVar5 = *pbVar24;
      local_68 = 0;
      do {
        if (bVar5 == 0x20) {
          do {
            bVar5 = pbVar24[1];
            pbVar24 = pbVar24 + 1;
          } while (bVar5 == 0x20);
        }
        else if (bVar5 == 0) {
          iVar7 = sqlite3Fts5GetTokenizer
                            (local_50,local_70,(int)local_68,local_58,local_48,local_a8);
          ppcVar18 = local_98;
          goto LAB_001c6b30;
        }
        if (bVar5 == 0x27) {
          pbVar14 = (byte *)fts5ConfigSkipLiteral((char *)pbVar24);
          if (pbVar14 == (byte *)0x0) goto LAB_001c6ae7;
        }
        else {
          lVar16 = 0;
          while (((char)bVar5 < '\0' || ((&DAT_001e2c10)[bVar5] != '\0'))) {
            lVar19 = lVar16 + 1;
            lVar16 = lVar16 + 1;
            bVar5 = pbVar24[lVar19];
          }
          if (lVar16 == 0) goto LAB_001c6ae7;
          pbVar14 = pbVar24 + lVar16;
        }
        sVar11 = (long)pbVar14 - (long)pbVar24;
        memcpy(pbVar13,pbVar24,sVar11);
        local_70[local_68] = (char *)pbVar13;
        if ((*pbVar13 - 0x22 < 0x3f) &&
           ((0x4200000000000021U >> ((ulong)(*pbVar13 - 0x22) & 0x3f) & 1) != 0)) {
          fts5Dequote((char *)pbVar13);
        }
        pbVar24 = pbVar14 + -1;
        do {
          bVar5 = pbVar24[1];
          pbVar24 = pbVar24 + 1;
        } while (bVar5 == 0x20);
        pbVar13 = pbVar13 + sVar11 + 1;
        local_68 = local_68 + 1;
      } while( true );
    }
    pcVar9 = sqlite3_mprintf("multiple tokenize=... directives");
    *local_a8 = pcVar9;
    iVar7 = 1;
  }
LAB_001c6b30:
  sqlite3_free(local_70);
  sqlite3_free(local_60);
  goto LAB_001c6d3d;
  while( true ) {
    uVar20 = ""[(byte)"content"[lVar19]];
    if (uVar20 != ""[puVar4[lVar19]]) {
      pbVar14 = puVar4 + lVar19;
      goto LAB_001c6a51;
    }
    lVar19 = lVar19 + 1;
    if (lVar16 == lVar19) break;
LAB_001c692d:
    if (lVar19 == 7) {
      uVar20 = '\0';
LAB_001c6a51:
      if (uVar20 != ""[*pbVar14]) {
        pbVar14 = puVar4 + 0xd;
        lVar19 = 0;
        goto LAB_001c6a7c;
      }
      break;
    }
  }
  if (local_b0->eContent == 0) {
    if (*pbVar24 != 0) {
      local_b0->eContent = 2;
      pcVar9 = sqlite3Fts5Mprintf(&local_b4,"%Q.%Q",local_b0->zDb,pbVar24);
      pFVar3->zContent = pcVar9;
      iVar7 = local_b4;
      goto LAB_001c6d3d;
    }
    local_b0->eContent = 1;
    goto LAB_001c6bb3;
  }
  pcVar9 = "multiple content=... directives";
  goto LAB_001c688a;
  while( true ) {
    uVar20 = ""[(byte)"content_rowid"[lVar19]];
    if (uVar20 != ""[puVar4[lVar19]]) {
      pbVar14 = puVar4 + lVar19;
      goto LAB_001c6b54;
    }
    lVar19 = lVar19 + 1;
    if (lVar16 == lVar19) break;
LAB_001c6a7c:
    if (lVar19 == 0xd) {
      uVar20 = '\0';
LAB_001c6b54:
      if (uVar20 != ""[*pbVar14]) {
        pbVar14 = puVar4 + 10;
        lVar19 = 0;
        goto LAB_001c6b80;
      }
      break;
    }
  }
  if (local_b0->zContentRowid == (char *)0x0) {
    pcVar9 = sqlite3Fts5Strndup(&local_b4,(char *)pbVar24,-1);
    pFVar3->zContentRowid = pcVar9;
    iVar7 = local_b4;
    goto LAB_001c6d3d;
  }
  pcVar9 = "multiple content_rowid=... directives";
  goto LAB_001c688a;
  while( true ) {
    uVar20 = ""[(byte)"columnsize"[lVar19]];
    if (uVar20 != ""[puVar4[lVar19]]) {
      pbVar14 = puVar4 + lVar19;
      goto LAB_001c6be6;
    }
    lVar19 = lVar19 + 1;
    if (lVar16 == lVar19) break;
LAB_001c6b80:
    if (lVar19 == 10) {
      uVar20 = '\0';
LAB_001c6be6:
      if (uVar20 != ""[*pbVar14]) {
        lVar19 = 0;
        goto LAB_001c6c15;
      }
      break;
    }
  }
  if (((*pbVar24 & 0xfe) == 0x30) && (pbVar24[1] == 0)) {
    local_b0->bColumnsize = (uint)(*pbVar24 == 0x31);
    goto LAB_001c6bb3;
  }
  pcVar9 = "malformed columnsize=... directive";
  goto LAB_001c688a;
  while( true ) {
    uVar20 = ""[(byte)"detail"[lVar19]];
    if (uVar20 != ""[puVar4[lVar19]]) {
      pbVar13 = puVar4 + lVar19;
      goto LAB_001c6c5e;
    }
    lVar19 = lVar19 + 1;
    if (lVar16 == lVar19) break;
LAB_001c6c15:
    if (lVar19 == 6) {
      uVar20 = '\0';
LAB_001c6c5e:
      if (uVar20 != ""[*pbVar13]) goto LAB_001c6d18;
      break;
    }
  }
  sVar11 = strlen((char *)pbVar24);
  iVar7 = -1;
  lVar16 = 0;
  pcVar9 = "none";
  do {
    if (0 < (int)sVar11) {
      lVar19 = 0;
      uVar21 = (int)sVar11 + 1;
      do {
        if ((ulong)(byte)pcVar9[lVar19] == 0) {
          uVar22 = ""[pbVar24[lVar19]];
          uVar20 = '\0';
LAB_001c6cd4:
          if (uVar20 != uVar22) goto LAB_001c6ced;
          break;
        }
        uVar20 = ""[(byte)pcVar9[lVar19]];
        uVar22 = ""[pbVar24[lVar19]];
        if (uVar20 != uVar22) goto LAB_001c6cd4;
        uVar21 = uVar21 - 1;
        lVar19 = lVar19 + 1;
      } while (1 < uVar21);
    }
    if (-1 < iVar7) goto LAB_001c6d0c;
    iVar7 = (&DAT_00210a48)[lVar16 * 4];
LAB_001c6ced:
    lVar16 = lVar16 + 1;
    pcVar9 = *(char **)(&DAT_00210a40 + lVar16 * 0x10);
  } while (lVar16 != 3);
  local_b0->eDetail = iVar7;
  if (-1 < iVar7) {
LAB_001c6bb3:
    iVar7 = 0;
    goto LAB_001c6d3d;
  }
LAB_001c6d0c:
  pcVar9 = "malformed detail=... directive";
LAB_001c688a:
  pcVar9 = sqlite3_mprintf(pcVar9);
LAB_001c6d2b:
  *local_a8 = pcVar9;
  iVar7 = 1;
LAB_001c6d3d:
  local_b8 = iVar7;
  iVar7 = local_b8;
  sqlite3_free(local_88.p);
  sqlite3_free(local_a0);
  bVar25 = iVar7 == 0;
  if ((!bVar25) || (lVar23 = lVar23 + 1, local_38 <= lVar23)) goto LAB_001c6d6a;
  goto LAB_001c64c5;
LAB_001c6ae7:
  pcVar9 = sqlite3_mprintf("parse error in tokenize directive");
  *local_a8 = pcVar9;
  iVar7 = 1;
  ppcVar18 = local_98;
  goto LAB_001c6b30;
LAB_001c6883:
  pcVar9 = "prefix length out of range (max 999)";
  goto LAB_001c688a;
LAB_001c645d:
  pcVar9 = sqlite3_mprintf("reserved fts5 table name: %s",pcVar9);
  *ppcVar18 = pcVar9;
  iVar7 = 1;
LAB_001c6da3:
  sqlite3Fts5ConfigFree(local_b0);
  ppOut = local_40;
LAB_001c6db2:
  *ppOut = (Fts5Config *)0x0;
  return iVar7;
}

Assistant:

static int sqlite3Fts5ConfigParse(
  Fts5Global *pGlobal,
  sqlite3 *db,
  int nArg,                       /* Number of arguments */
  const char **azArg,             /* Array of nArg CREATE VIRTUAL TABLE args */
  Fts5Config **ppOut,             /* OUT: Results of parse */
  char **pzErr                    /* OUT: Error message */
){
  int rc = SQLITE_OK;             /* Return code */
  Fts5Config *pRet;               /* New object to return */
  int i;
  sqlite3_int64 nByte;

  *ppOut = pRet = (Fts5Config*)sqlite3_malloc(sizeof(Fts5Config));
  if( pRet==0 ) return SQLITE_NOMEM;
  memset(pRet, 0, sizeof(Fts5Config));
  pRet->db = db;
  pRet->iCookie = -1;

  nByte = nArg * (sizeof(char*) + sizeof(u8));
  pRet->azCol = (char**)sqlite3Fts5MallocZero(&rc, nByte);
  pRet->abUnindexed = (u8*)&pRet->azCol[nArg];
  pRet->zDb = sqlite3Fts5Strndup(&rc, azArg[1], -1);
  pRet->zName = sqlite3Fts5Strndup(&rc, azArg[2], -1);
  pRet->bColumnsize = 1;
  pRet->eDetail = FTS5_DETAIL_FULL;
#ifdef SQLITE_DEBUG
  pRet->bPrefixIndex = 1;
#endif
  if( rc==SQLITE_OK && sqlite3_stricmp(pRet->zName, FTS5_RANK_NAME)==0 ){
    *pzErr = sqlite3_mprintf("reserved fts5 table name: %s", pRet->zName);
    rc = SQLITE_ERROR;
  }

  for(i=3; rc==SQLITE_OK && i<nArg; i++){
    const char *zOrig = azArg[i];
    const char *z;
    char *zOne = 0;
    char *zTwo = 0;
    int bOption = 0;
    int bMustBeCol = 0;

    z = fts5ConfigGobbleWord(&rc, zOrig, &zOne, &bMustBeCol);
    z = fts5ConfigSkipWhitespace(z);
    if( z && *z=='=' ){
      bOption = 1;
      z++;
      if( bMustBeCol ) z = 0;
    }
    z = fts5ConfigSkipWhitespace(z);
    if( z && z[0] ){
      int bDummy;
      z = fts5ConfigGobbleWord(&rc, z, &zTwo, &bDummy);
      if( z && z[0] ) z = 0;
    }

    if( rc==SQLITE_OK ){
      if( z==0 ){
        *pzErr = sqlite3_mprintf("parse error in \"%s\"", zOrig);
        rc = SQLITE_ERROR;
      }else{
        if( bOption ){
          rc = fts5ConfigParseSpecial(pGlobal, pRet, zOne, zTwo?zTwo:"", pzErr);
        }else{
          rc = fts5ConfigParseColumn(pRet, zOne, zTwo, pzErr);
          zOne = 0;
        }
      }
    }

    sqlite3_free(zOne);
    sqlite3_free(zTwo);
  }

  /* If a tokenizer= option was successfully parsed, the tokenizer has
  ** already been allocated. Otherwise, allocate an instance of the default
  ** tokenizer (unicode61) now.  */
  if( rc==SQLITE_OK && pRet->pTok==0 ){
    rc = fts5ConfigDefaultTokenizer(pGlobal, pRet);
  }

  /* If no zContent option was specified, fill in the default values. */
  if( rc==SQLITE_OK && pRet->zContent==0 ){
    const char *zTail = 0;
    assert( pRet->eContent==FTS5_CONTENT_NORMAL 
         || pRet->eContent==FTS5_CONTENT_NONE 
    );
    if( pRet->eContent==FTS5_CONTENT_NORMAL ){
      zTail = "content";
    }else if( pRet->bColumnsize ){
      zTail = "docsize";
    }

    if( zTail ){
      pRet->zContent = sqlite3Fts5Mprintf(
          &rc, "%Q.'%q_%s'", pRet->zDb, pRet->zName, zTail
      );
    }
  }

  if( rc==SQLITE_OK && pRet->zContentRowid==0 ){
    pRet->zContentRowid = sqlite3Fts5Strndup(&rc, "rowid", -1);
  }

  /* Formulate the zContentExprlist text */
  if( rc==SQLITE_OK ){
    rc = fts5ConfigMakeExprlist(pRet);
  }

  if( rc!=SQLITE_OK ){
    sqlite3Fts5ConfigFree(pRet);
    *ppOut = 0;
  }
  return rc;
}